

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O1

int isoent_traverse_tree(archive_write *a,vdd *vdd)

{
  time_t *ptVar1;
  wchar_t wVar2;
  int iVar3;
  idrent *idrent;
  code *pcVar4;
  isoent **ppiVar5;
  archive_rb_node *self;
  isoent *piVar6;
  isoent *piVar7;
  int iVar8;
  long lVar9;
  isoent *piVar10;
  char *pcVar11;
  undefined8 *puVar12;
  isoent **ppiVar13;
  bool bVar14;
  idr idr;
  void *local_e8;
  archive_rb_tree local_e0 [2];
  undefined4 local_c0;
  undefined8 local_b0 [4];
  undefined7 uStack_8f;
  undefined1 local_88;
  undefined7 uStack_87;
  undefined8 local_76;
  undefined4 local_55;
  undefined1 local_50;
  undefined4 local_35;
  
  ptVar1 = (time_t *)a->format_data;
  local_e8 = (void *)0x0;
  local_c0 = 0;
  if (vdd->vdd_type == VDD_JOLIET) {
    pcVar4 = isoent_gen_joliet_identifier;
  }
  else {
    if ((*(byte *)((long)ptVar1 + 0x10372) & 1) == 0) {
      pcVar11 = "";
      puVar12 = local_b0;
      for (lVar9 = 0x10; lVar9 != 0; lVar9 = lVar9 + -1) {
        *puVar12 = *(undefined8 *)pcVar11;
        pcVar11 = pcVar11 + 8;
        puVar12 = puVar12 + 1;
      }
    }
    else {
      pcVar11 = "";
      puVar12 = local_b0;
      for (lVar9 = 0x10; lVar9 != 0; lVar9 = lVar9 + -1) {
        *puVar12 = *(undefined8 *)pcVar11;
        pcVar11 = pcVar11 + 8;
        puVar12 = puVar12 + 1;
      }
      uStack_87 = 0x1010101010101;
      uStack_8f = 0x1010101010101;
      local_88 = 1;
      local_76 = 0x101010101010101;
      local_55 = 0x1010101;
      local_50 = 1;
      local_35 = 0x1010101;
    }
    pcVar4 = isoent_gen_iso9660_identifier;
  }
  iVar8 = 0;
  piVar6 = vdd->rootent;
  do {
    if (((piVar6->field_0xe8 & 1) != 0) &&
       (wVar2 = archive_entry_mtime_is_set(piVar6->file->entry), wVar2 == L'\0')) {
      archive_entry_set_mtime(piVar6->file->entry,*ptVar1,0);
      archive_entry_set_atime(piVar6->file->entry,*ptVar1,0);
      archive_entry_set_ctime(piVar6->file->entry,*ptVar1,0);
    }
    if ((piVar6->children).first == (isoent *)0x0) {
LAB_001738a8:
      piVar10 = piVar6->parent;
      piVar7 = piVar6;
      iVar3 = iVar8;
      if (piVar6 != piVar10) {
        do {
          piVar7 = piVar6->drnext;
          iVar3 = iVar8;
          if (piVar6->drnext != (isoent *)0x0) break;
          iVar8 = iVar8 + -1;
          bVar14 = piVar10 != piVar10->parent;
          piVar7 = piVar10;
          piVar6 = piVar10;
          piVar10 = piVar10->parent;
          iVar3 = iVar8;
        } while (bVar14);
      }
    }
    else {
      if (((vdd->vdd_type != VDD_JOLIET) && ((*(ushort *)((long)ptVar1 + 0x10372) & 0x180) == 0)) &&
         (vdd->max_depth <= iVar8 + 1)) {
        if (0 < (piVar6->children).cnt) {
          ptVar1[0x5a] = (time_t)piVar6;
        }
        goto LAB_001738a8;
      }
      iVar3 = (*pcVar4)(a,piVar6,&local_e8);
      if (iVar3 < 0) goto LAB_00173904;
      ppiVar5 = (isoent **)malloc((long)(piVar6->children).cnt << 3);
      if (ppiVar5 == (isoent **)0x0) {
        archive_set_error(&a->archive,0xc,"Can\'t allocate memory");
        iVar3 = -0x1e;
      }
      else {
        piVar6->children_sorted = ppiVar5;
        iVar3 = 0;
        self = __archive_rb_tree_iterate(local_e0,(archive_rb_node *)0x0,0);
        ppiVar13 = ppiVar5;
        for (; self != (archive_rb_node *)0x0; self = __archive_rb_tree_iterate(local_e0,self,1)) {
          *ppiVar13 = (isoent *)self[1].rb_info;
          ppiVar13 = ppiVar13 + 1;
        }
      }
      if (ppiVar5 == (isoent **)0x0) goto LAB_00173904;
      piVar7 = (piVar6->subdirs).first;
      if ((piVar7 == (isoent *)0x0) || (iVar3 = iVar8 + 1, vdd->max_depth <= iVar8 + 1))
      goto LAB_001738a8;
    }
    iVar8 = iVar3;
    piVar6 = piVar7;
  } while (piVar7 != piVar7->parent);
  iVar3 = 0;
LAB_00173904:
  free(local_e8);
  return iVar3;
}

Assistant:

static int
isoent_traverse_tree(struct archive_write *a, struct vdd* vdd)
{
	struct iso9660 *iso9660 = a->format_data;
	struct isoent *np;
	struct idr idr;
	int depth;
	int r;
	int (*genid)(struct archive_write *, struct isoent *, struct idr *);

	idr_init(iso9660, vdd, &idr);
	np = vdd->rootent;
	depth = 0;
	if (vdd->vdd_type == VDD_JOLIET)
		genid = isoent_gen_joliet_identifier;
	else
		genid = isoent_gen_iso9660_identifier;
	do {
		if (np->virtual &&
		    !archive_entry_mtime_is_set(np->file->entry)) {
			/* Set properly times to virtual directory */
			archive_entry_set_mtime(np->file->entry,
			    iso9660->birth_time, 0);
			archive_entry_set_atime(np->file->entry,
			    iso9660->birth_time, 0);
			archive_entry_set_ctime(np->file->entry,
			    iso9660->birth_time, 0);
		}
		if (np->children.first != NULL) {
			if (vdd->vdd_type != VDD_JOLIET &&
			    !iso9660->opt.rr && depth + 1 >= vdd->max_depth) {
				if (np->children.cnt > 0)
					iso9660->directories_too_deep = np;
			} else {
				/* Generate Identifier */
				r = genid(a, np, &idr);
				if (r < 0)
					goto exit_traverse_tree;
				r = isoent_make_sorted_files(a, np, &idr);
				if (r < 0)
					goto exit_traverse_tree;

				if (np->subdirs.first != NULL &&
				    depth + 1 < vdd->max_depth) {
					/* Enter to sub directories. */
					np = np->subdirs.first;
					depth++;
					continue;
				}
			}
		}
		while (np != np->parent) {
			if (np->drnext == NULL) {
				/* Return to the parent directory. */
				np = np->parent;
				depth--;
			} else {
				np = np->drnext;
				break;
			}
		}
	} while (np != np->parent);

	r = ARCHIVE_OK;
exit_traverse_tree:
	idr_cleanup(&idr);

	return (r);
}